

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::LazilyBuildDependenciesTest_Message_Test::
~LazilyBuildDependenciesTest_Message_Test(LazilyBuildDependenciesTest_Message_Test *this)

{
  (this->super_LazilyBuildDependenciesTest).super_Test._vptr_Test =
       (_func_int **)&PTR__LazilyBuildDependenciesTest_018e9280;
  DescriptorPool::~DescriptorPool(&(this->super_LazilyBuildDependenciesTest).pool_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            (&(this->super_LazilyBuildDependenciesTest).db_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(LazilyBuildDependenciesTest, Message) {
  ParseProtoAndAddToDb(R"pb(
    name: 'foo.proto'
    package: 'proto2_unittest'
    dependency: 'bar.proto'
    message_type {
      name: 'Foo'
      field {
        name: 'bar'
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_MESSAGE
        type_name: '.proto2_unittest.Bar'
      }
    })pb");
  AddSimpleMessageProtoFileToDb("bar", "Bar");

  // Verify neither has been built yet.
  EXPECT_FALSE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  const FileDescriptor* file = pool_.FindFileByName("foo.proto");

  // Verify only foo gets built when asking for foo.proto
  EXPECT_TRUE(file != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("foo.proto"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  // Verify calling FindFieldBy* works when the type of the field was
  // not built at cross link time. Verify this doesn't build the file
  // the field's type is defined in, as well.
  const Descriptor* desc = file->FindMessageTypeByName("Foo");
  const FieldDescriptor* field = desc->FindFieldByName("bar");
  EXPECT_TRUE(field != nullptr);
  EXPECT_EQ(field, desc->FindFieldByNumber(1));
  EXPECT_EQ(field, desc->FindFieldByLowercaseName("bar"));
  EXPECT_EQ(field, desc->FindFieldByCamelcaseName("bar"));
  EXPECT_FALSE(pool_.InternalIsFileLoaded("bar.proto"));

  // Finally, verify that if we call message_type() on the field, we will
  // build the file where the message is defined, and get a valid descriptor
  EXPECT_TRUE(field->message_type() != nullptr);
  EXPECT_TRUE(pool_.InternalIsFileLoaded("bar.proto"));
}